

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int Symbolcmpp(void *_a,void *_b)

{
  char *__s1;
  char *__s2;
  int iVar1;
  int iVar2;
  
  __s1 = (char *)**_a;
  iVar2 = 0;
  if ('Z' < *__s1) {
    iVar2 = 10000000;
  }
  __s2 = (char *)**_b;
  iVar1 = 0;
  if ('Z' < *__s2) {
    iVar1 = 10000000;
  }
  iVar2 = (iVar2 + *(int *)(*_a + 1)) - (iVar1 + *(int *)(*_b + 1));
  if (iVar2 == 0) {
    iVar1 = strcmp(__s1,__s2);
    if (iVar1 != 0) {
      __assert_fail("i1!=i2 || strcmp((**a).name,(**b).name)==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                    ,0x119c,"int Symbolcmpp(const void *, const void *)");
    }
  }
  return iVar2;
}

Assistant:

int Symbolcmpp(const void *_a, const void *_b)
{
  const struct symbol **a = (const struct symbol **) _a;
  const struct symbol **b = (const struct symbol **) _b;
  int i1 = (**a).index + 10000000*((**a).name[0]>'Z');
  int i2 = (**b).index + 10000000*((**b).name[0]>'Z');
  assert( i1!=i2 || strcmp((**a).name,(**b).name)==0 );
  return i1-i2;
}